

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_archiver_dir.c
# Opt level: O0

void * DIR_openArchive(PHYSFS_Io *io,char *name,int forWriting,int *claimed)

{
  int iVar1;
  size_t sVar2;
  size_t seplen;
  size_t namelen;
  char *retval;
  undefined1 local_58 [7];
  char dirsep;
  PHYSFS_Stat st;
  int *claimed_local;
  int forWriting_local;
  char *name_local;
  PHYSFS_Io *io_local;
  
  st._32_8_ = claimed;
  sVar2 = strlen(name);
  if (io != (PHYSFS_Io *)0x0) {
    __assert_fail("io == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/REGoth-project[P]physfs/src/physfs_archiver_dir.c"
                  ,0x33,"void *DIR_openArchive(PHYSFS_Io *, const char *, int, int *)");
  }
  iVar1 = __PHYSFS_platformStat(name,(PHYSFS_Stat *)local_58);
  if (iVar1 == 0) {
    io_local = (PHYSFS_Io *)0x0;
  }
  else if ((int)st.accesstime == 1) {
    *(undefined4 *)st._32_8_ = 1;
    io_local = (PHYSFS_Io *)(*__PHYSFS_AllocatorHooks.Malloc)(sVar2 + 2);
    if (io_local == (PHYSFS_Io *)0x0) {
      PHYSFS_setErrorCode(PHYSFS_ERR_OUT_OF_MEMORY);
      io_local = (PHYSFS_Io *)0x0;
    }
    else {
      strcpy((char *)io_local,name);
      if (*(char *)((long)io_local + (sVar2 - 1)) != '/') {
        *(char *)((long)&io_local->version + sVar2) = '/';
        *(char *)((long)&io_local->version + sVar2 + 1) = '\0';
      }
    }
  }
  else {
    PHYSFS_setErrorCode(PHYSFS_ERR_UNSUPPORTED);
    io_local = (PHYSFS_Io *)0x0;
  }
  return io_local;
}

Assistant:

static void *DIR_openArchive(PHYSFS_Io *io, const char *name,
                             int forWriting, int *claimed)
{
    PHYSFS_Stat st;
    const char dirsep = __PHYSFS_platformDirSeparator;
    char *retval = NULL;
    const size_t namelen = strlen(name);
    const size_t seplen = 1;

    assert(io == NULL);  /* shouldn't create an Io for these. */
    BAIL_IF_ERRPASS(!__PHYSFS_platformStat(name, &st), NULL);
    if (st.filetype != PHYSFS_FILETYPE_DIRECTORY)
        BAIL(PHYSFS_ERR_UNSUPPORTED, NULL);

    *claimed = 1;
    retval = allocator.Malloc(namelen + seplen + 1);
    BAIL_IF(retval == NULL, PHYSFS_ERR_OUT_OF_MEMORY, NULL);

    strcpy(retval, name);

    /* make sure there's a dir separator at the end of the string */
    if (retval[namelen - 1] != dirsep)
    {
        retval[namelen] = dirsep;
        retval[namelen + 1] = '\0';
    } /* if */

    return retval;
}